

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O2

void __thiscall PathTest::AppendTest(PathTest *this)

{
  bool bVar1;
  long lVar2;
  Path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    JetHead::Path::Path((Path *)&local_50,*(char **)((long)&appendTestData[0].path1 + lVar2));
    JetHead::Path::append((Path *)&local_50,*(char **)((long)&appendTestData[0].path2 + lVar2));
    bVar1 = std::operator!=(&local_50,*(char **)((long)&appendTestData[0].result + lVar2));
    if (bVar1) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xe9,"Append of %s and %s failed (%s)",
                 *(undefined8 *)((long)&appendTestData[0].path1 + lVar2),
                 *(undefined8 *)((long)&appendTestData[0].path2 + lVar2),local_50._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void PathTest::AppendTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( appendTestData ); i++ )
	{
		Path p = appendTestData[ i ].path1;
		p.append( appendTestData[ i ].path2 );
		if ( p != appendTestData[ i ].result )
		{
			TestFailed( "Append of %s and %s failed (%s)", 
				appendTestData[ i ].path1, 
				appendTestData[ i ].path2, 
				p.getString().c_str() );
		}
	}
}